

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.cpp
# Opt level: O0

void __thiscall CaDiCaL::Internal::init_enqueue(Internal *this,int idx)

{
  reference pvVar1;
  reference pvVar2;
  reference pvVar3;
  long lVar4;
  int in_ESI;
  long in_RDI;
  Link *l;
  undefined8 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  
  pvVar1 = std::vector<CaDiCaL::Link,_std::allocator<CaDiCaL::Link>_>::operator[]
                     ((vector<CaDiCaL::Link,_std::allocator<CaDiCaL::Link>_> *)(in_RDI + 600),
                      (long)in_ESI);
  if (*(int *)(in_RDI + 0xe70) == 0) {
    pvVar1->next = 0;
    if (*(int *)(in_RDI + 0x244) == 0) {
      *(int *)(in_RDI + 0x240) = in_ESI;
    }
    else {
      in_stack_ffffffffffffffd0 = in_ESI;
      pvVar2 = std::vector<CaDiCaL::Link,_std::allocator<CaDiCaL::Link>_>::operator[]
                         ((vector<CaDiCaL::Link,_std::allocator<CaDiCaL::Link>_> *)(in_RDI + 600),
                          (long)*(int *)(in_RDI + 0x244));
      pvVar2->next = in_stack_ffffffffffffffd0;
    }
    lVar4 = *(long *)(in_RDI + 0x1218) + 1;
    *(long *)(in_RDI + 0x1218) = lVar4;
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)(in_RDI + 0x310),(long)in_ESI);
    *pvVar3 = lVar4;
    pvVar1->prev = *(int *)(in_RDI + 0x244);
    *(int *)(in_RDI + 0x244) = in_ESI;
    update_queue_unassigned
              ((Internal *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (int)((ulong)lVar4 >> 0x20));
  }
  else {
    pvVar1->prev = 0;
    if (*(int *)(in_RDI + 0x240) == 0) {
      *(int *)(in_RDI + 0x244) = in_ESI;
      pvVar3 = std::vector<long,_std::allocator<long>_>::operator[]
                         ((vector<long,_std::allocator<long>_> *)(in_RDI + 0x310),(long)in_ESI);
      *pvVar3 = 0;
    }
    else {
      in_stack_ffffffffffffffd4 = in_ESI;
      pvVar2 = std::vector<CaDiCaL::Link,_std::allocator<CaDiCaL::Link>_>::operator[]
                         ((vector<CaDiCaL::Link,_std::allocator<CaDiCaL::Link>_> *)(in_RDI + 600),
                          (long)*(int *)(in_RDI + 0x240));
      pvVar2->prev = in_stack_ffffffffffffffd4;
      pvVar3 = std::vector<long,_std::allocator<long>_>::operator[]
                         ((vector<long,_std::allocator<long>_> *)(in_RDI + 0x310),
                          (long)*(int *)(in_RDI + 0x240));
      lVar4 = *pvVar3;
      pvVar3 = std::vector<long,_std::allocator<long>_>::operator[]
                         ((vector<long,_std::allocator<long>_> *)(in_RDI + 0x310),(long)in_ESI);
      *pvVar3 = lVar4 + -1;
    }
    pvVar1->next = *(int *)(in_RDI + 0x240);
    *(int *)(in_RDI + 0x240) = in_ESI;
    if (*(int *)(in_RDI + 0x248) == 0) {
      update_queue_unassigned
                ((Internal *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    }
  }
  return;
}

Assistant:

inline void Internal::init_enqueue (int idx) {
  Link &l = links[idx];
  if (opts.reverse) {
    l.prev = 0;
    if (queue.first) {
      assert (!links[queue.first].prev);
      links[queue.first].prev = idx;
      btab[idx] = btab[queue.first] - 1;
    } else {
      assert (!queue.last);
      queue.last = idx;
      btab[idx] = 0;
    }
    assert (btab[idx] <= stats.bumped);
    l.next = queue.first;
    queue.first = idx;
    if (!queue.unassigned)
      update_queue_unassigned (queue.last);
  } else {
    l.next = 0;
    if (queue.last) {
      assert (!links[queue.last].next);
      links[queue.last].next = idx;
    } else {
      assert (!queue.first);
      queue.first = idx;
    }
    btab[idx] = ++stats.bumped;
    l.prev = queue.last;
    queue.last = idx;
    update_queue_unassigned (queue.last);
  }
}